

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void __thiscall argo::lexer::read_string(lexer *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  json_parser_exception *this_00;
  size_t byte_index;
  ulong len;
  bool bVar4;
  token local_60;
  
  bVar4 = false;
  len = 0;
  do {
    iVar2 = (*this->m_reader->_vptr_reader[2])();
    if (iVar2 < 0x10) {
      this_00 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
      sVar3 = reader::get_byte_index(this->m_reader);
      json_parser_exception::json_parser_exception(this_00,invalid_character_e,(char)iVar2,sVar3);
LAB_001133e5:
      __cxa_throw(this_00,&json_parser_exception::typeinfo,std::exception::~exception);
    }
    if ((iVar2 != 0x22) || (bVar4)) {
      if (this->m_max_token_length <= len) {
        this_00 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
        sVar3 = this->m_max_token_length;
        byte_index = reader::get_byte_index(this->m_reader);
        json_parser_exception::json_parser_exception(this_00,string_too_long_e,sVar3,byte_index);
        goto LAB_001133e5;
      }
      this->m_buffer[len] = (char)iVar2;
      len = len + 1;
      bVar4 = iVar2 == 0x5c;
      bVar1 = true;
    }
    else {
      token::token(&local_60,string_e,this->m_buffer,len);
      token::operator=(&this->m_token,&local_60);
      token::~token(&local_60);
      bVar1 = false;
    }
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void lexer::read_string()
{
    size_t n = 0;
    bool in_escape = false;

    while (true)
    {
        int c;

        c = m_reader.next();
        if (c <= 0xf)
        {
            throw json_parser_exception(
                        json_parser_exception::invalid_character_e,
                        static_cast<char>(c),
                        m_reader.get_byte_index());
        }
        else if (c == '"' && !in_escape)
        {
            m_token = token(token::string_e, m_buffer, n);
            return;
        }
        else
        {
            if (n >= m_max_token_length)
            {
                throw json_parser_exception(
                            json_parser_exception::string_too_long_e,
                            m_max_token_length,
                            m_reader.get_byte_index());
            }
            else
            {
                m_buffer[n++] = c;
            }
        }
        in_escape = (c == '\\');
    }
}